

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::SliceHelper<unsigned_int>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              uint length,Arguments *args,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  uint32 start;
  anon_class_24_3_6139f5b6_for_newObjectCreationFunction newObjectCreationFunction;
  ScriptContext *pSVar3;
  JavascriptArray *pJVar4;
  bool bVar5;
  uint uVar6;
  BOOL BVar7;
  int iVar8;
  Var pvVar9;
  undefined4 extraout_var;
  undefined4 *puVar10;
  RecyclableObject *this;
  undefined4 extraout_var_00;
  TypedArrayBase *obj_00;
  JavascriptFunction *defaultConstructor;
  JavascriptFunction *instanceObj;
  JavascriptArray *pJVar11;
  JavascriptNativeIntArray *dstArray;
  JavascriptNativeIntArray *srcArray;
  TypedArrayBase *pTVar12;
  undefined4 extraout_var_01;
  JavascriptNativeFloatArray *dstArray_00;
  JavascriptNativeFloatArray *srcArray_00;
  Var newValue;
  undefined4 in_register_0000000c;
  uint32 i;
  uint uVar13;
  undefined4 uStack_a4;
  undefined8 local_98;
  Var element;
  TypedArrayBase *local_88;
  JavascriptArray *local_80;
  undefined8 local_78;
  RecyclableObject *local_70;
  JavascriptArray *local_68;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  bool local_33;
  bool local_32;
  bool local_31 [6];
  bool isBuiltinArrayCtor;
  bool isIntArray;
  bool isFloatArray;
  
  jsReentLock._28_4_ = in_register_0000000c;
  jsReentLock._24_4_ = length;
  local_60 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_60)->noJsReentrancy;
  ((ThreadContext *)local_60)->noJsReentrancy = true;
  local_88 = typedArrayBase;
  local_70 = obj;
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,pArr);
  local_32 = false;
  local_78 = 0;
  local_31[0] = false;
  local_33 = true;
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pArr);
  if (((ulong)args->Info & 0xfffffe) != 0) {
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pvVar9 = Arguments::operator[](args,1);
    uVar6 = GetFromIndex<unsigned_int>(pvVar9,jsReentLock._24_4_,scriptContext,true);
    local_78 = CONCAT44(extraout_var,uVar6);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    *(bool *)((long)local_60 + 0x108) = true;
    if (2 < (*(uint *)&args->Info & 0xffffff)) {
      pvVar9 = Arguments::operator[](args,2);
      if (pvVar9 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar5) goto LAB_00a5cb18;
        *puVar10 = 0;
      }
      bVar5 = TaggedInt::Is(pvVar9);
      if ((ulong)pvVar9 >> 0x32 == 0 && !bVar5) {
        this = UnsafeVarTo<Js::RecyclableObject>(pvVar9);
        if (this == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar5) goto LAB_00a5cb18;
          *puVar10 = 0;
        }
        TVar1 = ((this->type).ptr)->typeId;
        if ((int)TVar1 < 0x58) {
          if (TVar1 == TypeIds_Undefined) goto LAB_00a5bfdf;
        }
        else {
          BVar7 = RecyclableObject::IsExternal(this);
          if (BVar7 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar10 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar5) goto LAB_00a5cb18;
            *puVar10 = 0;
          }
        }
      }
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pvVar9 = Arguments::operator[](args,2);
      jsReentLock._24_4_ = GetFromIndex<unsigned_int>(pvVar9,jsReentLock._24_4_,scriptContext,true);
      jsReentLock._28_4_ = extraout_var_00;
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
    }
LAB_00a5bfdf:
    uVar6 = jsReentLock._24_4_ - (uint)local_78;
    if (jsReentLock._24_4_ < (uint)local_78) {
      uVar6 = 0;
    }
    jsReentLock._24_8_ = ZEXT48(uVar6);
  }
  if (pArr == (JavascriptArray *)0x0) {
LAB_00a5c05f:
    pArr = (JavascriptArray *)0x0;
  }
  else {
    bVar5 = IsNonES5Array(local_70);
    if (!bVar5) {
      bVar5 = VarIsImpl<Js::ES5Array>(local_70);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x18f8,"(VarIs<ES5Array>(obj))",
                                    "The array should have been converted to an ES5Array");
        if (!bVar5) goto LAB_00a5cb18;
        *puVar10 = 0;
      }
      goto LAB_00a5c05f;
    }
  }
  BVar7 = TypedArrayBase::IsDetachedTypedArray(local_70);
  if (BVar7 != 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ebe5,L"Array.prototype.slice");
  }
  if (local_88 == (TypedArrayBase *)0x0 && pArr == (JavascriptArray *)0x0) {
    bVar5 = VarIsImpl<Js::TypedArrayBase>(local_70);
    if (bVar5) {
      obj_00 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(local_70);
    }
    else {
LAB_00a5c23a:
      obj_00 = (TypedArrayBase *)0x0;
    }
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    local_68 = (JavascriptArray *)
               ArraySpeciesCreate<unsigned_int>
                         (local_70,jsReentLock._24_4_,scriptContext,(bool *)0x0,(bool *)0x0,
                          &local_33);
    *(bool *)((long)local_60 + 0x108) = true;
    if (local_68 == (JavascriptArray *)0x0) goto LAB_00a5c2b2;
LAB_00a5c279:
    pJVar11 = TryVarToNonES5Array(local_68);
    if (pJVar11 == (JavascriptArray *)0x0) {
      pJVar11 = (JavascriptArray *)0x0;
      pJVar4 = local_68;
    }
    else {
      JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pJVar11);
      pJVar4 = local_68;
    }
  }
  else {
    if (local_88 == (TypedArrayBase *)0x0) {
      if (pArr == (JavascriptArray *)0x0) goto LAB_00a5c23a;
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      local_68 = (JavascriptArray *)
                 ArraySpeciesCreate<unsigned_int>
                           (pArr,jsReentLock._24_4_,scriptContext,&local_32,local_31,&local_33);
      *(bool *)((long)local_60 + 0x108) = true;
      if (local_68 != (JavascriptArray *)0x0) {
        obj_00 = (TypedArrayBase *)0x0;
        goto LAB_00a5c279;
      }
      GetArrayTypeAndConvert(pArr,&local_32,local_31);
      obj_00 = (TypedArrayBase *)0x0;
    }
    else {
      pvVar9 = Arguments::operator[](args,0);
      defaultConstructor = TypedArrayBase::GetDefaultConstructor(pvVar9,scriptContext);
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      instanceObj = (JavascriptFunction *)
                    JavascriptOperators::SpeciesConstructor
                              ((RecyclableObject *)local_88,defaultConstructor,scriptContext);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
      local_33 = false;
      if (pArr != (JavascriptArray *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x1910,"(pArr == nullptr)","pArr == nullptr");
        if (bVar5) {
          *puVar10 = 0;
          Throw::FatalInternalError(-0x7fffbffb);
        }
        goto LAB_00a5cb18;
      }
      bVar5 = JavascriptOperators::IsConstructor((RecyclableObject *)instanceObj);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x1911,"(JavascriptOperators::IsConstructor(constructor))",
                                    "JavascriptOperators::IsConstructor(constructor)");
        if (!bVar5) goto LAB_00a5cb18;
        *puVar10 = 0;
      }
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      newObjectCreationFunction._12_4_ = uStack_a4;
      newObjectCreationFunction.newLenT = jsReentLock._24_4_;
      newObjectCreationFunction.constructor = (RecyclableObject *)instanceObj;
      newObjectCreationFunction.scriptContext = scriptContext;
      pvVar9 = JavascriptOperators::
               NewObjectCreationHelper_ReentrancySafe<Js::JavascriptArray::SliceHelper<unsigned_int>(Js::JavascriptArray*,Js::TypedArrayBase*,Js::RecyclableObject*,unsigned_int,Js::Arguments&,Js::ScriptContext*)::_lambda()_1_>
                         ((RecyclableObject *)instanceObj,instanceObj == defaultConstructor,
                          scriptContext->threadContext,newObjectCreationFunction);
      local_68 = (JavascriptArray *)VarTo<Js::RecyclableObject>(pvVar9);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
      obj_00 = local_88;
      if (local_68 != (JavascriptArray *)0x0) goto LAB_00a5c279;
    }
LAB_00a5c2b2:
    pJVar11 = CreateNewArrayHelper(jsReentLock._24_4_,local_32,local_31[0],pArr,scriptContext);
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pJVar11);
    JsReentLock::setSecondObjectForMutation((JsReentLock *)local_60,pJVar11);
    pJVar4 = pJVar11;
    if (pJVar11 == (JavascriptArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x194f,"(newObj)","newObj");
      if (!bVar5) goto LAB_00a5cb18;
      *puVar10 = 0;
      pJVar11 = (JavascriptArray *)0x0;
      local_68 = (JavascriptArray *)0x0;
      pJVar4 = local_68;
    }
  }
  local_68 = pJVar4;
  if (jsReentLock._24_4_ == 0) goto LAB_00a5c9c7;
  local_80 = pJVar11;
  if (pArr == (JavascriptArray *)0x0) {
LAB_00a5c483:
    if (obj_00 == (TypedArrayBase *)0x0) {
LAB_00a5c4b7:
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      SliceObjectHelper(local_70,(uint32)local_78,0,local_80,(RecyclableObject *)local_68,
                        jsReentLock._24_4_,scriptContext);
      goto LAB_00a5c9c7;
    }
    bVar5 = VarIsImpl<Js::TypedArrayBase>((RecyclableObject *)obj_00);
    if (!bVar5) {
      bVar5 = VarIsImpl<Js::TypedArrayBase>((RecyclableObject *)obj_00);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x19bd,"(VarIsCorrectType(typedArrayBase))",
                                    "VarIsCorrectType(typedArrayBase)");
        if (!bVar5) goto LAB_00a5cb18;
        *puVar10 = 0;
      }
      Throw::FatalInternalError(-0x7fffbffb);
    }
    bVar5 = VarIsImpl<Js::TypedArrayBase>((RecyclableObject *)local_68);
    pJVar11 = local_80;
    if (bVar5) {
      pTVar12 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)local_68);
    }
    else {
      pTVar12 = (TypedArrayBase *)0x0;
    }
    if (pJVar11 == (JavascriptArray *)0x0 && pTVar12 == (TypedArrayBase *)0x0) {
      AssertCount = AssertCount + 1;
      element = scriptContext;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x19c4,"(newArr != nullptr)","newArr != nullptr");
      if (bVar5) {
        *puVar10 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
LAB_00a5cb18:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    element = scriptContext;
    for (uVar6 = 0; pSVar3 = (ScriptContext *)element, jsReentLock._24_4_ != uVar6;
        uVar6 = uVar6 + 1) {
      uVar13 = (int)local_78 + uVar6;
      if ((local_88 != (TypedArrayBase *)0x0) ||
         (iVar8 = (*(obj_00->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x24])(obj_00,(ulong)uVar13), iVar8 == 1)) {
        iVar8 = (*(obj_00->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(obj_00,(ulong)uVar13);
        if (pTVar12 == (TypedArrayBase *)0x0) {
          (*(local_80->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                    (local_80,(ulong)uVar6,CONCAT44(extraout_var_01,iVar8),0);
        }
        else {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          (*(pTVar12->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x70])
                    (pTVar12,(ulong)uVar6,CONCAT44(extraout_var_01,iVar8));
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          *(bool *)((long)local_60 + 0x108) = true;
        }
      }
    }
  }
  else {
    bVar5 = IsNonES5Array(local_70);
    if (!bVar5) {
      bVar5 = VarIsImpl<Js::ES5Array>(local_70);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x195b,"(VarIs<ES5Array>(obj))",
                                    "The array should have been converted to an ES5Array");
        if (!bVar5) goto LAB_00a5cb18;
        *puVar10 = 0;
      }
      goto LAB_00a5c483;
    }
    bVar5 = HasAnyES5ArrayInPrototypeChain(pArr,false);
    if (bVar5) goto LAB_00a5c4b7;
    if ((local_80 == (JavascriptArray *)0x0) || (local_33 != true)) {
      for (uVar6 = 0; pSVar3 = scriptContext, jsReentLock._24_4_ != uVar6; uVar6 = uVar6 + 1) {
        *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        iVar8 = (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x71])(pArr,(ulong)((int)local_78 + uVar6),&local_98);
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        *(bool *)((long)local_60 + 0x108) = true;
        if (iVar8 != 0) {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          iVar8 = (*(local_68->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x29])(local_68,(ulong)uVar6,local_98,4);
          ThrowErrorOnFailure(iVar8,scriptContext,uVar6);
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          *(bool *)((long)local_60 + 0x108) = true;
          bVar5 = IsNonES5Array(local_70);
          if (!bVar5) {
            bVar5 = VarIsImpl<Js::ES5Array>(local_70);
            pJVar11 = local_80;
            if (!bVar5) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar10 = 1;
              bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x19b5,"(VarIs<ES5Array>(obj))",
                                          "The array should have been converted to an ES5Array");
              if (!bVar5) goto LAB_00a5cb18;
              *puVar10 = 0;
            }
            *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            SliceObjectHelper(local_70,(uint32)local_78,uVar6 + 1,pJVar11,
                              (RecyclableObject *)local_68,jsReentLock._24_4_,scriptContext);
            goto LAB_00a5c9c7;
          }
        }
      }
    }
    else {
      bVar5 = IsDirectAccessArray(local_80);
      if (bVar5) {
        start = (uint32)local_78;
        uVar6 = jsReentLock._24_4_;
        uVar13 = start + uVar6;
        if ((((pArr->head).ptr)->length < uVar13) || (((local_80->head).ptr)->size < uVar6)) {
          if (local_32 == true) {
            *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            element = scriptContext;
            dstArray = VarTo<Js::JavascriptNativeIntArray,Js::JavascriptArray>(local_80);
            srcArray = VarTo<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pArr);
            CopyNativeIntArrayElements(dstArray,0,srcArray,(uint32)local_78,uVar13);
            JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          }
          else {
            *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            if (local_31[0] == true) {
              element = scriptContext;
              dstArray_00 = VarTo<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(local_80);
              srcArray_00 = VarTo<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pArr);
              CopyNativeFloatArrayElements(dstArray_00,0,srcArray_00,(uint32)local_78,uVar13);
              JsReentLock::MutateArrayObject((JsReentLock *)local_60);
            }
            else {
              element = scriptContext;
              CopyArrayElements(local_80,0,pArr,start,uVar13);
              JsReentLock::MutateArrayObject((JsReentLock *)local_60);
            }
          }
        }
        else if (local_32 == true) {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          element = scriptContext;
          SliceHelper<int>(pArr,local_80,start,uVar6);
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        }
        else {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          if (local_31[0] == true) {
            element = scriptContext;
            SliceHelper<double>(pArr,local_80,start,uVar6);
            JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          }
          else {
            element = scriptContext;
            SliceHelper<void*>(pArr,local_80,start,uVar6);
            JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          }
        }
        *(bool *)((long)local_60 + 0x108) = true;
        pSVar3 = (ScriptContext *)element;
      }
      else {
        element = scriptContext;
        if (DAT_0143bfb9 == '\0') {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x198c,"((Js::Configuration::Global.flags.ForceES5Array))",
                                      "newArr can only be ES5Array when it is forced");
          if (!bVar5) goto LAB_00a5cb18;
          *puVar10 = 0;
        }
        for (uVar6 = 0; pSVar3 = (ScriptContext *)element, jsReentLock._24_4_ != uVar6;
            uVar6 = uVar6 + 1) {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          iVar8 = (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x71])
                            (pArr,(ulong)((int)local_78 + uVar6),&local_98);
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          *(bool *)((long)local_60 + 0x108) = true;
          if (iVar8 != 0) {
            (*(local_80->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x29])(local_80,(ulong)uVar6,local_98,0);
            bVar5 = IsNonES5Array(local_70);
            if (!bVar5) {
              bVar5 = VarIsImpl<Js::ES5Array>(local_70);
              pvVar9 = element;
              if (!bVar5) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar10 = 1;
                bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                            ,0x199c,"(VarIs<ES5Array>(obj))",
                                            "The array should have been converted to an ES5Array");
                if (!bVar5) goto LAB_00a5cb18;
                *puVar10 = 0;
              }
              *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
              SliceObjectHelper(local_70,(uint32)local_78,uVar6 + 1,local_80,
                                (RecyclableObject *)local_68,jsReentLock._24_4_,
                                (ScriptContext *)pvVar9);
              goto LAB_00a5c9c7;
            }
          }
        }
      }
    }
  }
  element = pSVar3;
  pvVar9 = element;
  if (local_88 == (TypedArrayBase *)0x0) {
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    newValue = JavascriptNumber::ToVar(jsReentLock._24_4_,(ScriptContext *)element);
    JavascriptOperators::SetProperty
              (local_68,(RecyclableObject *)local_68,0xd1,newValue,(ScriptContext *)pvVar9,
               PropertyOperation_ThrowIfNotExtensible);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    *(bool *)((long)local_60 + 0x108) = true;
  }
  pJVar11 = TryVarToNonES5Array(local_68);
  if (pJVar11 != (JavascriptArray *)0x0) {
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])
              (pJVar11);
  }
LAB_00a5c9c7:
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_68;
}

Assistant:

Var JavascriptArray::SliceHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        JavascriptArray* newArr = nullptr;
        RecyclableObject* newObj = nullptr;
        bool isIntArray = false;
        bool isFloatArray = false;
        bool isTypedArrayEntryPoint = typedArrayBase != nullptr;
        bool isBuiltinArrayCtor = true;
        T startT = 0;
        T newLenT = length;
        T endT = length;

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(pArr);
#endif
        if (args.Info.Count > 1)
        {
            JS_REENTRANT(jsReentLock, startT = GetFromIndex(args[1], length, scriptContext));

            if (args.Info.Count > 2 && JavascriptOperators::GetTypeId(args[2]) != TypeIds_Undefined)
            {
                JS_REENTRANT(jsReentLock, endT = GetFromIndex(args[2], length, scriptContext));
            }

            newLenT = endT > startT ? endT - startT : 0;
        }

        // Side effects (such as defining a property in a ToPrimitive call) during evaluation of arguments start or end may convert the array to an ES5 array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (TypedArrayBase::IsDetachedTypedArray(obj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, _u("Array.prototype.slice"));
        }

        // If we came from Array.prototype.slice and source object is not a JavascriptArray, source could be a TypedArray
        if (!isTypedArrayEntryPoint && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        // If the entry point is %TypedArray%.prototype.slice or the source object is an Array exotic object we should try to load the constructor property
        // and use it to construct the return object.
        if (isTypedArrayEntryPoint)
        {
            JavascriptFunction* defaultConstructor = TypedArrayBase::GetDefaultConstructor(args[0], scriptContext);
            JS_REENTRANT(jsReentLock,
                RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(typedArrayBase, defaultConstructor, scriptContext));
            isBuiltinArrayCtor = false;

            AssertAndFailFast(pArr == nullptr);
            AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

            bool isDefaultConstructor = constructor == defaultConstructor;
            JS_REENTRANT(jsReentLock,
                newObj = VarTo<RecyclableObject>(
                    JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
                    {
                        Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(newLenT, scriptContext) };
                        Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                        return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), (uint32)newLenT, scriptContext);
                    }));
            );
        }

        else if (pArr != nullptr)
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, newObj = ArraySpeciesCreate(pArr, newLenT, scriptContext, &isIntArray, &isFloatArray, &isBuiltinArrayCtor));
        }

        // skip the typed array and "pure" array case, we still need to handle special arrays like es5array, remote array, and proxy of array.
        else
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, newObj = ArraySpeciesCreate(obj, newLenT, scriptContext, nullptr, nullptr, &isBuiltinArrayCtor));
        }

        // If we didn't create a new object above we will create a new array here.
        // This is the pre-ES6 behavior or the case of calling Array.prototype.slice with a constructor argument that is not a constructor function.
        if (newObj == nullptr)
        {
            if (pArr)
            {
                pArr->GetArrayTypeAndConvert(&isIntArray, &isFloatArray);
            }

            if (newLenT > JavascriptArray::MaxArrayLength)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
            }

            newArr = CreateNewArrayHelper(static_cast<uint32>(newLenT), isIntArray, isFloatArray, pArr, scriptContext);
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
            newObj = newArr;
            SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, newArr);
        }
        else
        {
            // If the new object we created is an array, remember that as it will save us time setting properties in the object below
            newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            if (newArr)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
            }
        }

        uint32 start  = (uint32) startT;
        uint32 newLen = (uint32) newLenT;

        // We at least have to have newObj as a valid object
        Assert(newObj);

        // Bail out early if the new object will have zero length.
        if (newLen == 0)
        {
            return newObj;
        }

        // The ArraySpeciesCreate call above could have converted the source array into an ES5Array. If this happens
        // we will process the array elements like an ES5Array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (pArr)
        {
            if (HasAnyES5ArrayInPrototypeChain(pArr))
            {
                JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceObjectHelper(obj, start, 0u, newArr, newObj, newLen, scriptContext));
            }

            // If we constructed a new Array object, we have some nice helpers here
            if (newArr && isBuiltinArrayCtor)
            {
                if (JavascriptArray::IsDirectAccessArray(newArr))
                {
                    if (((start + newLen) <= pArr->head->length) && newLen <= newArr->head->size) //Fast Path
                    {
                        if (isIntArray)
                        {
                            JS_REENTRANT(jsReentLock, SliceHelper<int32>(pArr, newArr, start, newLen));
                        }
                        else if (isFloatArray)
                        {
                            JS_REENTRANT(jsReentLock, SliceHelper<double>(pArr, newArr, start, newLen));
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock, SliceHelper<Var>(pArr, newArr, start, newLen));
                        }
                    }
                    else
                    {
                        if (isIntArray)
                        {
                            JS_REENTRANT(jsReentLock, CopyNativeIntArrayElements(VarTo<JavascriptNativeIntArray>(newArr), 0, VarTo<JavascriptNativeIntArray>(pArr), start, start + newLen));
                        }
                        else if (isFloatArray)
                        {
                            JS_REENTRANT(jsReentLock, CopyNativeFloatArrayElements(VarTo<JavascriptNativeFloatArray>(newArr), 0, VarTo<JavascriptNativeFloatArray>(pArr), start, start + newLen));
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock, CopyArrayElements(newArr, 0u, pArr, start, start + newLen));
                        }
                    }
                }
                else
                {
                    AssertMsg(CONFIG_FLAG(ForceES5Array), "newArr can only be ES5Array when it is forced");
                    Var element;
                    for (uint32 i = 0; i < newLen; i++)
                    {
                        JS_REENTRANT(jsReentLock, BOOL gotItem = pArr->DirectGetItemAtFull(i + start, &element));
                        if (!gotItem)
                        {
                            continue;
                        }

                        newArr->SetItem(i, element, PropertyOperation_None);

                        // Side-effects in the prototype lookup may have changed the source array into an ES5Array. If this happens
                        // we will process the rest of the array elements like an ES5Array.
                        if (!JavascriptArray::IsNonES5Array(obj))
                        {
                            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceObjectHelper(obj, start, i + 1, newArr, newObj, newLen, scriptContext));
                        }
                    }
                }
            }
            else
            {
                // The constructed object isn't an array, we'll need to use normal object manipulation
                Var element;

                for (uint32 i = 0; i < newLen; i++)
                {
                    JS_REENTRANT(jsReentLock, BOOL gotItem = pArr->DirectGetItemAtFull(i + start, &element));
                    if (!gotItem)
                    {
                        continue;
                    }

                    JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(newObj, i, element), scriptContext, i));

                    // Side-effects in the prototype lookup may have changed the source array into an ES5Array. If this happens
                    // we will process the rest of the array elements like an ES5Array.
                    if (!JavascriptArray::IsNonES5Array(obj))
                    {
                        AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                        JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceObjectHelper(obj, start, i + 1, newArr, newObj, newLen, scriptContext));
                    }
                }
            }
        }
        else if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));

            // Source is a TypedArray, we must have created the return object via a call to constructor, but newObj may not be a TypedArray (or an array either)
            TypedArrayBase* newTypedArray = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);

            if (!newTypedArray)
            {
                AssertAndFailFast(newArr != nullptr);
            }

            Var element;

            for (uint32 i = 0; i < newLen; i++)
            {
                // We only need to call HasItem in the case that we are called from Array.prototype.slice
                if (!isTypedArrayEntryPoint && !typedArrayBase->HasItem(i + start))
                {
                    continue;
                }

                element = typedArrayBase->DirectGetItem(i + start);

                // The object we got back from the constructor might not be a TypedArray. In fact, it could be any object.
                if (newTypedArray)
                {
                    JS_REENTRANT(jsReentLock, newTypedArray->DirectSetItem(i, element));
                }
                else
                {
                    newArr->SetItem(i, element, PropertyOperation_None);
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceObjectHelper(obj, start, 0u, newArr, newObj, newLen, scriptContext));;
        }

        if (!isTypedArrayEntryPoint)
        {
            JS_REENTRANT(jsReentLock, JavascriptOperators::SetProperty(newObj, newObj, Js::PropertyIds::length, JavascriptNumber::ToVar(newLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible));
        }

#ifdef VALIDATE_ARRAY
        JavascriptArray * jsArr = JavascriptArray::TryVarToNonES5Array(newObj);
        if (jsArr)
        {
            jsArr->ValidateArray();
        }
#endif

        return newObj;
    }